

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  rnnenum *prVar5;
  rnnvarset **pprVar6;
  rnnvarset *prVar7;
  int *piVar8;
  ulong uVar9;
  rnnvarset *prVar10;
  char *pcVar11;
  char *name;
  rnnvalue *prVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  size_t sVar20;
  byte *__string;
  bool bVar21;
  
  if (parent != (rnnvarinfo *)0x0) {
    vi->prefenum = parent->prefenum;
  }
  pcVar11 = vi->prefixstr;
  if (pcVar11 != (char *)0x0) {
    iVar3 = strcmp(pcVar11,"none");
    if (iVar3 == 0) {
      prVar5 = (rnnenum *)0x0;
    }
    else {
      prVar5 = rnn_findenum(db,pcVar11);
    }
    vi->prefenum = prVar5;
  }
  if (parent != (rnnvarinfo *)0x0) {
    for (lVar16 = 0; lVar16 < parent->varsetsnum; lVar16 = lVar16 + 1) {
      iVar3 = vi->varsetsmax;
      if (iVar3 <= vi->varsetsnum) {
        iVar4 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar4 = 0x10;
        }
        vi->varsetsmax = iVar4;
        pprVar6 = (rnnvarset **)realloc(vi->varsets,(long)iVar4 << 3);
        vi->varsets = pprVar6;
      }
      prVar10 = parent->varsets[lVar16];
      prVar7 = (rnnvarset *)calloc(0x10,1);
      prVar5 = prVar10->venum;
      prVar7->venum = prVar5;
      sVar20 = (size_t)prVar5->valsnum;
      piVar8 = (int *)calloc(4,sVar20);
      prVar7->variants = piVar8;
      if ((long)sVar20 < 1) {
        sVar20 = 0;
      }
      for (sVar14 = 0; sVar20 != sVar14; sVar14 = sVar14 + 1) {
        piVar8[sVar14] = prVar10->variants[sVar14];
      }
      iVar3 = vi->varsetsnum;
      vi->varsetsnum = iVar3 + 1;
      vi->varsets[iVar3] = prVar7;
    }
  }
  pcVar11 = vi->varsetstr;
  prVar5 = vi->prefenum;
  if (((prVar5 == (rnnenum *)0x0) && (parent != (rnnvarinfo *)0x0)) && (pcVar11 == (char *)0x0)) {
    pcVar11 = parent->varsetstr;
    vi->varsetstr = pcVar11;
  }
  if (pcVar11 != (char *)0x0) {
    prVar5 = rnn_findenum(db,pcVar11);
  }
  __string = (byte *)vi->variantsstr;
  if (__string == (byte *)0x0) {
LAB_00106a3e:
    if ((vi->dead == 0) && (prVar5 = vi->prefenum, prVar5 != (rnnenum *)0x0)) {
      uVar15 = 0;
      uVar9 = (ulong)(uint)vi->varsetsnum;
      if (vi->varsetsnum < 1) {
        uVar9 = uVar15;
      }
      do {
        if (uVar9 == uVar15) {
          prVar12 = *prVar5->vals;
          goto LAB_00106a9f;
        }
        pprVar6 = vi->varsets + uVar15;
        uVar15 = uVar15 + 1;
      } while ((*pprVar6)->venum != prVar5);
      uVar15 = 0;
      uVar9 = (ulong)(uint)prVar5->valsnum;
      if (prVar5->valsnum < 1) {
        uVar9 = uVar15;
      }
      do {
        uVar17 = uVar15;
        if (uVar9 == uVar17) {
          return;
        }
        uVar15 = uVar17 + 1;
      } while ((*pprVar6)->variants[uVar17] == 0);
      prVar12 = prVar5->vals[uVar17];
LAB_00106a9f:
      vi->prefix = prVar12->name;
    }
  }
  else {
    if (prVar5 != (rnnenum *)0x0) {
      uVar2 = prVar5->valsnum;
      uVar13 = vi->varsetsnum;
      uVar9 = 0;
      uVar15 = 0;
      if (0 < (int)uVar13) {
        uVar15 = (ulong)uVar13;
      }
LAB_00106819:
      if (uVar15 != uVar9) goto code_r0x0010681e;
      prVar10 = (rnnvarset *)calloc(0x10,1);
      prVar10->venum = prVar5;
      piVar8 = (int *)calloc(4,(long)(int)uVar2);
      prVar10->variants = piVar8;
      uVar15 = 0;
      uVar9 = 0;
      if (0 < (int)uVar2) {
        uVar9 = (ulong)uVar2;
      }
      for (; uVar9 != uVar15; uVar15 = uVar15 + 1) {
        piVar8[uVar15] = 1;
      }
      iVar3 = vi->varsetsmax;
      pprVar6 = vi->varsets;
      if (iVar3 <= (int)uVar13) {
        iVar4 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar4 = 0x10;
        }
        vi->varsetsmax = iVar4;
        pprVar6 = (rnnvarset **)realloc(pprVar6,(long)iVar4 << 3);
        vi->varsets = pprVar6;
        uVar13 = vi->varsetsnum;
      }
      vi->varsetsnum = uVar13 + 1;
      pprVar6[(int)uVar13] = prVar10;
LAB_001068cd:
      while( true ) {
        for (; bVar1 = *__string, bVar1 == 0x20; __string = __string + 1) {
        }
        pbVar19 = __string;
        pbVar18 = __string;
        if (bVar1 == 0) break;
        while( true ) {
          pbVar18 = pbVar18 + 1;
          if ((bVar1 < 0x3b) && ((0x400200100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
          bVar1 = pbVar19[1];
          pbVar19 = pbVar19 + 1;
        }
        if ((long)pbVar19 - (long)__string == 0) {
          pcVar11 = (char *)0x0;
        }
        else {
          pcVar11 = strndup((char *)__string,(long)pbVar19 - (long)__string);
        }
        if ((bVar1 & 0xdf) == 0) {
          iVar3 = findvidx(db,prVar5,pcVar11);
          if (iVar3 != -1) {
            prVar10->variants[iVar3] = prVar10->variants[iVar3] | 2;
          }
        }
        else {
          sVar20 = 0;
          for (; (*pbVar18 & 0xdf) != 0; pbVar18 = pbVar18 + 1) {
            sVar20 = sVar20 + 1;
          }
          if (sVar20 == 0) {
            name = (char *)0x0;
          }
          else {
            name = strndup((char *)(pbVar19 + 1),sVar20);
          }
          if (pcVar11 == (char *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = findvidx(db,prVar5,pcVar11);
          }
          uVar13 = uVar2;
          if (name != (char *)0x0) {
            iVar4 = findvidx(db,prVar5,name);
            uVar13 = (uint)(*pbVar19 == 0x2d) + iVar4;
          }
          if ((iVar3 != -1) && (uVar13 != 0xffffffff)) {
            for (lVar16 = (long)iVar3; lVar16 < (int)uVar13; lVar16 = lVar16 + 1) {
              prVar10->variants[lVar16] = prVar10->variants[lVar16] | 2;
            }
          }
          free(name);
          pbVar19 = pbVar18;
        }
        free(pcVar11);
        __string = pbVar19;
      }
      vi->dead = 1;
      uVar15 = 0;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar15;
      }
      for (; uVar9 != uVar15; uVar15 = uVar15 + 1) {
        bVar21 = prVar10->variants[uVar15] == 3;
        prVar10->variants[uVar15] = (uint)bVar21;
        if (bVar21) {
          vi->dead = 0;
        }
      }
      goto LAB_00106a3e;
    }
    fprintf(_stderr,"%s: tried to use variants without active varset!\n",what);
    db->estatus = 1;
  }
  return;
code_r0x0010681e:
  prVar10 = vi->varsets[uVar9];
  uVar9 = uVar9 + 1;
  if (prVar10->venum == prVar5) goto LAB_001068cd;
  goto LAB_00106819;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = vi->prefenum->vals[i]->name;
					return;
				}
		} else {
			vi->prefix = vi->prefenum->vals[0]->name;
		}
	}
}